

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O1

void __thiscall
bvh_node::bvh_node(bvh_node *this,
                  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                  *objects,size_t start,size_t end,double time0,double time1)

{
  __normal_iterator<std::shared_ptr<hittable>_*,_std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>_>
  __first;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  long lVar3;
  shared_ptr<hittable> *psVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  code *pcVar11;
  ulong uVar12;
  pointer psVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __normal_iterator<std::shared_ptr<hittable>_*,_std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>_>
  __last;
  _Iter_comp_iter<bool_(*)(std::shared_ptr<hittable>,_std::shared_ptr<hittable>)> __comp;
  shared_ptr<hittable> sVar14;
  shared_ptr<hittable> sVar15;
  undefined1 local_d9;
  size_t start_local;
  double time1_local;
  double time0_local;
  size_t end_local;
  aabb box_left;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  element_type local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  aabb box_right;
  
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR_hit_0012dff8;
  (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->box)._min.e[0] = 0.0;
  (this->box)._min.e[1] = 0.0;
  (this->box)._min.e[2] = 0.0;
  (this->box)._max.e[0] = 0.0;
  (this->box)._max.e[1] = 0.0;
  (this->box)._max.e[2] = 0.0;
  start_local = start;
  time1_local = time1;
  time0_local = time0;
  end_local = end;
  iVar8 = rand();
  iVar8 = (int)((double)iVar8 * 4.656612873077393e-10 * 3.0 + 0.0);
  pcVar11 = box_z_compare;
  if (iVar8 == 1) {
    pcVar11 = box_y_compare;
  }
  __comp._M_comp = box_x_compare;
  if (iVar8 != 0) {
    __comp._M_comp = pcVar11;
  }
  uVar12 = end_local - start_local;
  psVar13 = (objects->
            super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (uVar12 == 2) {
    local_78._vptr_hittable =
         (_func_int **)
         psVar13[start_local].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_70 = psVar13[start_local].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_70->_M_use_count = local_70->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_70->_M_use_count = local_70->_M_use_count + 1;
      }
    }
    pcVar10 = (char *)(objects->
                      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    local_88 = ((__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> *)
               &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)pcVar10 + (start_local + 1) * 0x10))->_vptr__Sp_counted_base)->_M_ptr;
    local_80 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)pcVar10 + (start_local + 1) * 0x10))->_M_use_count)->_M_pi;
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar10 = &__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_80->_M_use_count = local_80->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_80->_M_use_count = local_80->_M_use_count + 1;
      }
    }
    sVar14.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_88;
    sVar14.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_78;
    sVar15.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar10;
    sVar15.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
    bVar7 = (*__comp._M_comp)(sVar14,sVar15);
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
    }
    psVar13 = (objects->
              super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
              )._M_impl.super__Vector_impl_data._M_start + start_local;
    psVar4 = &this->right;
    if (bVar7) {
      (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar13->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &(psVar13->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
      psVar13 = (objects->
                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                )._M_impl.super__Vector_impl_data._M_start + start_local + 1;
    }
    else {
      (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           psVar13[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &psVar13[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      psVar13 = (objects->
                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                )._M_impl.super__Vector_impl_data._M_start + start_local;
    }
    this_00 = &(psVar13->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
    (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar13->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
LAB_00106043:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(psVar4->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               this_00);
  }
  else {
    if (uVar12 == 1) {
      (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           psVar13[start_local].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00 = &(this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,&psVar13[start_local].
                          super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      psVar4 = &this->left;
      goto LAB_00106043;
    }
    if (end_local != start_local) {
      __first._M_current = psVar13 + start_local;
      __last._M_current = psVar13 + end_local;
      uVar9 = (long)(end_local * 0x10 + start_local * -0x10) >> 4;
      lVar3 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<hittable>*,std::vector<std::shared_ptr<hittable>,std::allocator<std::shared_ptr<hittable>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::shared_ptr<hittable>,std::shared_ptr<hittable>)>>
                (__first,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,__comp);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<hittable>*,std::vector<std::shared_ptr<hittable>,std::allocator<std::shared_ptr<hittable>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::shared_ptr<hittable>,std::shared_ptr<hittable>)>>
                (__first,__last,__comp);
    }
    box_right._min.e[0] = (double)((uVar12 >> 1) + start_local);
    box_left._min.e[0] = 0.0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<bvh_node,std::allocator<bvh_node>,std::vector<std::shared_ptr<hittable>,std::allocator<std::shared_ptr<hittable>>>&,unsigned_long&,unsigned_long&,double&,double&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(box_left._min.e + 1),
               (bvh_node **)&box_left,(allocator<bvh_node> *)&local_d9,objects,&start_local,
               (unsigned_long *)&box_right,&time0_local,&time1_local);
    dVar6 = box_left._min.e[1];
    dVar5 = box_left._min.e[0];
    box_left._min.e[0] = 0.0;
    box_left._min.e[1] = 0.0;
    p_Var1 = (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)dVar5;
    (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar6;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (box_left._min.e[1] != 0.0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)box_left._min.e[1]);
    }
    box_left._min.e[0] = 0.0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<bvh_node,std::allocator<bvh_node>,std::vector<std::shared_ptr<hittable>,std::allocator<std::shared_ptr<hittable>>>&,unsigned_long&,unsigned_long&,double&,double&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(box_left._min.e + 1),
               (bvh_node **)&box_left,(allocator<bvh_node> *)&local_d9,objects,
               (unsigned_long *)&box_right,&end_local,&time0_local,&time1_local);
    dVar6 = box_left._min.e[1];
    dVar5 = box_left._min.e[0];
    box_left._min.e[0] = 0.0;
    box_left._min.e[1] = 0.0;
    p_Var1 = (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)dVar5;
    (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar6;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (box_left._min.e[1] != 0.0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)box_left._min.e[1]);
    }
  }
  box_left._max.e[1] = 0.0;
  box_left._max.e[2] = 0.0;
  box_left._min.e[2] = 0.0;
  box_left._max.e[0] = 0.0;
  box_left._min.e[0] = 0.0;
  box_left._min.e[1] = 0.0;
  box_right._max.e[1] = 0.0;
  box_right._max.e[2] = 0.0;
  box_right._min.e[2] = 0.0;
  box_right._max.e[0] = 0.0;
  box_right._min.e[0] = 0.0;
  box_right._min.e[1] = 0.0;
  iVar8 = (*((this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_hittable[1])(SUB84(time0_local,0),time1_local);
  if ((char)iVar8 != '\0') {
    peVar2 = (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar8 = (*peVar2->_vptr_hittable[1])(SUB84(time0_local,0),time1_local,peVar2,&box_right);
    if ((char)iVar8 != '\0') goto LAB_001060d1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"No bounding box in bvh_node constructor.\n",0x29);
LAB_001060d1:
  (this->box)._min.e[0] =
       (double)(~-(ulong)(box_left._min.e[0] <= box_right._min.e[0]) & (ulong)box_right._min.e[0] |
               (ulong)box_left._min.e[0] & -(ulong)(box_left._min.e[0] <= box_right._min.e[0]));
  (this->box)._min.e[1] =
       (double)(~-(ulong)(box_left._min.e[1] <= box_right._min.e[1]) & (ulong)box_right._min.e[1] |
               (ulong)box_left._min.e[1] & -(ulong)(box_left._min.e[1] <= box_right._min.e[1]));
  (this->box)._min.e[2] =
       (double)(~-(ulong)(box_left._min.e[2] <= box_right._min.e[2]) & (ulong)box_right._min.e[2] |
               (ulong)box_left._min.e[2] & -(ulong)(box_left._min.e[2] <= box_right._min.e[2]));
  (this->box)._max.e[0] =
       (double)(~-(ulong)(box_right._max.e[0] <= box_left._max.e[0]) & (ulong)box_right._max.e[0] |
               (ulong)box_left._max.e[0] & -(ulong)(box_right._max.e[0] <= box_left._max.e[0]));
  (this->box)._max.e[1] =
       (double)(~-(ulong)(box_right._max.e[1] <= box_left._max.e[1]) & (ulong)box_right._max.e[1] |
               (ulong)box_left._max.e[1] & -(ulong)(box_right._max.e[1] <= box_left._max.e[1]));
  (this->box)._max.e[2] =
       (double)(~-(ulong)(box_right._max.e[2] <= box_left._max.e[2]) & (ulong)box_right._max.e[2] |
               (ulong)box_left._max.e[2] & -(ulong)(box_right._max.e[2] <= box_left._max.e[2]));
  return;
}

Assistant:

bvh_node::bvh_node(
        std::vector<shared_ptr<hittable>>& objects,
        size_t start, size_t end, double time0, double time1
) {
    int axis = random_int(0,2);
    auto comparator = (axis == 0) ? box_x_compare
                    : (axis == 1) ? box_y_compare
                                  : box_z_compare;

    size_t object_span = end - start;

    if (object_span == 1) {
        left = right = objects[start];
    } else if (object_span == 2) {
        if (comparator(objects[start], objects[start+1])) {
            left = objects[start];
            right = objects[start+1];
        } else {
            left = objects[start+1];
            right = objects[start];
        }
    } else {
        std::sort(objects.begin() + start, objects.begin() + end, comparator);

        auto mid = start + object_span/2;
        left = make_shared<bvh_node>(objects, start, mid, time0, time1);
        right = make_shared<bvh_node>(objects, mid, end, time0, time1);
    }

    aabb box_left, box_right;

    if (  !left->bounding_box (time0, time1, box_left)
          || !right->bounding_box(time0, time1, box_right)
            )
        std::cerr << "No bounding box in bvh_node constructor.\n";

    box = surrounding_box(box_left, box_right);
}